

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O0

vector<Image,_std::allocator<Image>_> *
anon_unknown.dwarf_f7f8::LoadCgaSpritesheet
          (vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  uint8_t val;
  byte bVar1;
  size_type sVar2;
  reference this;
  const_reference pvVar3;
  const_reference pvVar4;
  int iStack_74;
  value_type b;
  int byte_offset;
  int x;
  int y;
  int image_offset;
  value_type *image;
  int image_index;
  allocator<Image> local_49;
  Image local_48;
  undefined1 local_21;
  ulong local_20;
  size_type num_images;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  vector<Image,_std::allocator<Image>_> *images;
  
  num_images = (size_type)data;
  data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  local_21 = 0;
  local_20 = sVar2 >> 8;
  Image::Image(&local_48,0xf,0xf);
  std::allocator<Image>::allocator(&local_49);
  std::vector<Image,_std::allocator<Image>_>::vector
            (__return_storage_ptr__,sVar2 >> 8,&local_48,&local_49);
  std::allocator<Image>::~allocator(&local_49);
  Image::~Image(&local_48);
  for (image._0_4_ = 0; (ulong)(long)(int)image < local_20; image._0_4_ = (int)image + 1) {
    this = std::vector<Image,_std::allocator<Image>_>::operator[]
                     (__return_storage_ptr__,(long)(int)image);
    for (byte_offset = 1; byte_offset < 0x10; byte_offset = byte_offset + 1) {
      for (iStack_74 = 0; iStack_74 < 4; iStack_74 = iStack_74 + 1) {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)num_images,
                            (long)((int)image * 0x100 + byte_offset * 4 + iStack_74));
        val = *pvVar3;
        bVar1 = HalfNibble(val,3);
        pvVar4 = std::array<color_t,_4UL>::operator[]
                           ((array<color_t,_4UL> *)(anonymous_namespace)::cga_palette,(ulong)bVar1);
        Image::Set(this,iStack_74 << 2,byte_offset + -1,pvVar4);
        bVar1 = HalfNibble(val,2);
        pvVar4 = std::array<color_t,_4UL>::operator[]
                           ((array<color_t,_4UL> *)(anonymous_namespace)::cga_palette,(ulong)bVar1);
        Image::Set(this,iStack_74 * 4 + 1,byte_offset + -1,pvVar4);
        bVar1 = HalfNibble(val,1);
        pvVar4 = std::array<color_t,_4UL>::operator[]
                           ((array<color_t,_4UL> *)(anonymous_namespace)::cga_palette,(ulong)bVar1);
        Image::Set(this,iStack_74 * 4 + 2,byte_offset + -1,pvVar4);
        if (iStack_74 != 3) {
          bVar1 = HalfNibble(val,0);
          pvVar4 = std::array<color_t,_4UL>::operator[]
                             ((array<color_t,_4UL> *)(anonymous_namespace)::cga_palette,(ulong)bVar1
                             );
          Image::Set(this,iStack_74 * 4 + 3,byte_offset + -1,pvVar4);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadCgaSpritesheet(std::vector<uint8_t> const& data) {
  auto const num_images = data.size() / kImageAlignmentInBytes;
  std::vector<Image> images(num_images, Image(kImageWidth, kImageHeight));

  for (auto image_index = 0; image_index < num_images; ++image_index) {
    auto& image = images[image_index];
    auto const image_offset = image_index * kImageAlignmentInBytes;

    // Ignore first full row (contains garbage)
    for (auto y = 1; y < kCellHeight; ++y) {
      for (auto x = 0; x < kCgaBytesPerRow; ++x) {
        auto const byte_offset = image_offset + (y * kCgaBytesPerRow) + x;
        auto const b = data[byte_offset];

        // (y - 1) to compensate for ignoring the first row
        image.Set(x * kCgaPixelsPerByte, y - 1, cga_palette[HalfNibble(b, 3)]);
        image.Set(x * kCgaPixelsPerByte + 1, y - 1,
                  cga_palette[HalfNibble(b, 2)]);
        image.Set(x * kCgaPixelsPerByte + 2, y - 1,
                  cga_palette[HalfNibble(b, 1)]);

        // Last byte of row only contains 3 pixels (because final image
        // is 15 wide, not 16 wide)
        if (x != kCgaBytesPerRow - 1) {
          image.Set(x * kCgaPixelsPerByte + 3, y - 1,
                    cga_palette[HalfNibble(b, 0)]);
        }
      }
    }
  }

  return images;
}